

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O3

void __thiscall
GCSFilter::GCSFilter
          (GCSFilter *this,Params *params,
          vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_filter,
          bool skip_decode_check)

{
  pointer puVar1;
  undefined3 uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  char *pcVar5;
  char in_CL;
  undefined7 in_register_00000011;
  undefined8 *puVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  SpanReader stream;
  BitStreamReader<SpanReader> local_48;
  SpanReader local_38;
  long local_28;
  
  puVar6 = (undefined8 *)CONCAT71(in_register_00000011,skip_decode_check);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined3 *)&params->field_0x11;
  uVar3 = params->m_M;
  (this->m_params).m_P = params->m_P;
  *(undefined3 *)&(this->m_params).field_0x11 = uVar2;
  (this->m_params).m_M = uVar3;
  uVar4 = params->m_siphash_k1;
  (this->m_params).m_siphash_k0 = params->m_siphash_k0;
  (this->m_params).m_siphash_k1 = uVar4;
  puVar1 = (pointer)puVar6[1];
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*puVar6;
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)puVar6[2];
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[2] = 0;
  local_38.m_data.m_data =
       (this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.m_data.m_size =
       (long)(this->m_encoded).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_38.m_data.m_data;
  uVar4 = ReadCompactSize<SpanReader>(&local_38,true);
  this->m_N = (uint32_t)uVar4;
  if (uVar4 >> 0x20 == 0) {
    this->m_F = uVar4 * (this->m_params).m_M;
    if (in_CL == '\0') {
      local_48._8_4_ = local_48._8_4_ & 0xffffff00;
      local_48.m_offset = 8;
      local_48.m_istream = &local_38;
      if ((uint32_t)uVar4 != 0) {
        uVar7 = 0;
        do {
          GolombRiceDecode<SpanReader>(&local_48,(this->m_params).m_P);
          uVar7 = uVar7 + 1;
        } while (uVar7 < this->m_N);
      }
      if (local_38.m_data.m_size != 0) {
        pcVar5 = (char *)__cxa_allocate_exception(0x20);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar5,(error_code *)"encoded_filter contains excess data");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_0045e6fc;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    pcVar5 = (char *)__cxa_allocate_exception(0x20);
    local_48._8_8_ = std::iostream_category();
    local_48.m_istream = (SpanReader *)CONCAT44(local_48.m_istream._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure(pcVar5,(error_code *)"N must be <2^32");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_0045e6fc:
  __stack_chk_fail();
}

Assistant:

GCSFilter::GCSFilter(const Params& params, std::vector<unsigned char> encoded_filter, bool skip_decode_check)
    : m_params(params), m_encoded(std::move(encoded_filter))
{
    SpanReader stream{m_encoded};

    uint64_t N = ReadCompactSize(stream);
    m_N = static_cast<uint32_t>(N);
    if (m_N != N) {
        throw std::ios_base::failure("N must be <2^32");
    }
    m_F = static_cast<uint64_t>(m_N) * static_cast<uint64_t>(m_params.m_M);

    if (skip_decode_check) return;

    // Verify that the encoded filter contains exactly N elements. If it has too much or too little
    // data, a std::ios_base::failure exception will be raised.
    BitStreamReader bitreader{stream};
    for (uint64_t i = 0; i < m_N; ++i) {
        GolombRiceDecode(bitreader, m_params.m_P);
    }
    if (!stream.empty()) {
        throw std::ios_base::failure("encoded_filter contains excess data");
    }
}